

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_info.cpp
# Opt level: O0

ostream * CGL::Collada::operator<<(ostream *os,LightInfo *light)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"LightInfo: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 0x28));
  poVar1 = std::operator<<(poVar1," (id:");
  poVar1 = std::operator<<(poVar1,(string *)(in_RSI + 8));
  std::operator<<(poVar1,")");
  std::operator<<(in_RDI," [");
  switch(*(undefined4 *)(in_RSI + 0x48)) {
  case 0:
    std::operator<<(in_RDI,"type=none");
  case 1:
    poVar1 = std::operator<<(in_RDI," type=ambient");
    poVar1 = std::operator<<(poVar1," spectrum=");
    CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x50));
    break;
  case 2:
    poVar1 = std::operator<<(in_RDI," type=directional");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x50));
    poVar1 = std::operator<<(poVar1," direction=");
    CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x90));
    break;
  case 3:
    poVar1 = std::operator<<(in_RDI," type=area");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x50));
    poVar1 = std::operator<<(poVar1," direction=");
    CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x90));
    break;
  case 4:
    poVar1 = std::operator<<(in_RDI," type=point");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x50));
    poVar1 = std::operator<<(poVar1," position=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x70));
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xd8));
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xdc));
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xe0));
    break;
  case 5:
    poVar1 = std::operator<<(in_RDI," type=spot");
    poVar1 = std::operator<<(poVar1," spectrum=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x50));
    poVar1 = std::operator<<(poVar1," position=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x70));
    poVar1 = std::operator<<(poVar1," direction=");
    poVar1 = (ostream *)CGL::operator<<(poVar1,(Vector3D *)(in_RSI + 0x90));
    poVar1 = std::operator<<(poVar1," falloff_deg=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xd0));
    poVar1 = std::operator<<(poVar1," falloff_exp=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xd4));
    poVar1 = std::operator<<(poVar1," constant_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xd8));
    poVar1 = std::operator<<(poVar1," linear_att=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xdc));
    poVar1 = std::operator<<(poVar1," quadratic_att=");
    std::ostream::operator<<(poVar1,*(float *)(in_RSI + 0xe0));
  }
  std::operator<<(in_RDI," ]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LightInfo& light) {

  os << "LightInfo: " << light.name << " (id:" << light.id << ")";

  os << " [";

    switch (light.light_type) {
      case LightType::NONE:
        os << "type=none";
      case LightType::AMBIENT:
        os << " type=ambient"
           << " spectrum=" << light.spectrum;
        break;
      case LightType::DIRECTIONAL:
        os << " type=directional"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::AREA:
        os << " type=area"
           << " spectrum=" << light.spectrum
           << " direction=" << light.direction;
        break;
      case LightType::POINT:
        os << " type=point"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
      case LightType::SPOT:
        os << " type=spot"
           << " spectrum=" << light.spectrum
           << " position="  << light.position
           << " direction=" << light.direction
           << " falloff_deg=" << light.falloff_deg
           << " falloff_exp=" << light.falloff_exp
           << " constant_att="  << light.constant_att
           << " linear_att="    << light.linear_att
           << " quadratic_att=" << light.quadratic_att;
        break;
    }

  os << " ]";

  return os;
}